

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86_avx512::forward
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint kernel_h;
  uint dilation_w;
  uint dilation_h;
  uint stride_w;
  uint stride_h;
  int *piVar5;
  Layer *pLVar6;
  undefined4 uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  Option *opt_00;
  uint uVar19;
  int iVar20;
  bool bVar21;
  Mat *top_blob_00;
  Mat local_128;
  uint local_e0;
  uint local_dc;
  Mat local_d8;
  ulong local_90;
  ulong local_88;
  int local_7c;
  Mat local_78;
  
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).int8_scale_term != 0)) {
    iVar11 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar11;
  }
  iVar11 = (this->super_Convolution).kernel_w;
  iVar20 = (this->super_Convolution).kernel_h;
  if (iVar20 == 1 && (iVar11 == 1 && bottom_blob->dims == 1)) {
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    if ((bottom_blob->elemsize & 0xf) == 0) {
      if (&local_128 != bottom_blob) {
        piVar5 = bottom_blob->refcount;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        local_128.data = bottom_blob->data;
        local_128.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
        local_128.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
        local_128.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
        local_128.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
        local_128.elempack = bottom_blob->elempack;
        local_128.allocator = bottom_blob->allocator;
        uVar7 = bottom_blob->d;
        local_128.d = uVar7;
      }
      local_128.dims = 3;
      local_128.w = 1;
      local_128.h = 1;
      local_128.c = bottom_blob->w;
      local_128.cstep = 1;
    }
    else {
      Mat::reshape(&local_d8,bottom_blob,1,1,bottom_blob->w,opt->workspace_allocator);
      piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_128.allocator == (Allocator *)0x0) {
            if (local_128.data != (void *)0x0) {
              free(local_128.data);
            }
          }
          else {
            (*(local_128.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      local_128.data = local_d8.data;
      local_128.refcount._0_4_ = local_d8.refcount._0_4_;
      local_128.refcount._4_4_ = local_d8.refcount._4_4_;
      local_128.elemsize._0_4_ = (uint)local_d8.elemsize;
      local_128.elemsize._4_4_ = local_d8.elemsize._4_4_;
      local_128.elempack = local_d8.elempack;
      local_128.allocator = local_d8.allocator;
      local_128.dims = local_d8.dims;
      local_128.w = local_d8.w;
      local_128.h = local_d8.h;
      local_128.d = local_d8.d;
      local_128.c = local_d8.c;
      local_128.cstep = local_d8.cstep;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_d8.allocator == (Allocator *)0x0) {
            if (local_d8.data != (void *)0x0) {
              free(local_d8.data);
            }
          }
          else {
            (*(local_d8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar11 = -100;
      if ((local_128.data == (void *)0x0) || ((long)local_128.c * local_128.cstep == 0))
      goto LAB_0018b487;
    }
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 0;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    iVar11 = (*(this->super_Convolution).super_Layer._vptr_Layer[7])(this,&local_128,&local_d8,opt);
    if (iVar11 == 0) {
      if (((uint)local_d8.elemsize & 0xf) == 0) {
        if (&local_d8 != top_blob) {
          piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_d8.data;
          top_blob->refcount = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_d8.elemsize._4_4_,(uint)local_d8.elemsize);
          top_blob->elempack = local_d8.elempack;
          top_blob->allocator = local_d8.allocator;
          top_blob->dims = local_d8.dims;
          top_blob->w = local_d8.w;
          top_blob->h = local_d8.h;
          top_blob->d = local_d8.d;
          top_blob->c = local_d8.c;
          top_blob->cstep = local_d8.cstep;
        }
        top_blob->dims = 1;
        local_128.cstep = (size_t)local_d8.c;
        top_blob->w = local_d8.c;
        top_blob->h = 1;
        top_blob->c = 1;
      }
      else {
        Mat::reshape(&local_78,&local_d8,local_d8.c,opt->blob_allocator);
        if (&local_78 != top_blob) {
          if (local_78.refcount != (int *)0x0) {
            LOCK();
            *local_78.refcount = *local_78.refcount + 1;
            UNLOCK();
          }
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_78.data;
          top_blob->refcount = local_78.refcount;
          top_blob->elemsize = local_78.elemsize;
          top_blob->elempack = local_78.elempack;
          top_blob->allocator = local_78.allocator;
          top_blob->dims = local_78.dims;
          top_blob->w = local_78.w;
          top_blob->h = local_78.h;
          top_blob->d = local_78.d;
          top_blob->c = local_78.c;
          top_blob->cstep = local_78.cstep;
        }
        if (local_78.refcount != (int *)0x0) {
          LOCK();
          *local_78.refcount = *local_78.refcount + -1;
          UNLOCK();
          if (*local_78.refcount == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar11 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_0018b428;
      }
      iVar11 = 0;
    }
LAB_0018b428:
    piVar5 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
LAB_0018b487:
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.w = 0;
    local_d8.dims = 0;
    local_d8.elempack = 0;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.refcount._0_4_ = 0;
    local_d8.data = (void *)0x0;
    local_d8.cstep = 0;
    local_d8.c = 0;
    piVar5 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    return iVar11;
  }
  local_dc = bottom_blob->c;
  iVar12 = (this->super_Convolution).dilation_w;
  uVar18 = bottom_blob->elemsize;
  iVar3 = (this->super_Convolution).dilation_h;
  local_90 = (ulong)bottom_blob->elempack;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  Convolution::make_padding(&this->super_Convolution,bottom_blob,&local_128,opt);
  uVar8 = local_90;
  iVar14 = -100;
  if ((local_128.data == (void *)0x0) || ((long)local_128.c * local_128.cstep == 0))
  goto LAB_0018b1fd;
  local_88 = CONCAT44(local_88._4_4_,local_128.w);
  iVar11 = (~((iVar11 + -1) * iVar12) + local_128.w) / (this->super_Convolution).stride_w + 1;
  local_7c = local_128.h;
  iVar20 = (~((iVar20 + -1) * iVar3) + local_128.h) / (this->super_Convolution).stride_h + 1;
  local_e0 = 1;
  if (opt->use_packing_layout == true) {
    uVar4 = (this->super_Convolution).num_output;
    if ((uVar4 & 0xf) == 0) {
      local_e0 = 0x10;
    }
    else if ((uVar4 & 7) == 0) {
      local_e0 = 8;
    }
    else {
      local_e0 = (uint)((uVar4 & 3) == 0) * 3 + 1;
    }
  }
  top_blob_00 = top_blob;
  Mat::create(top_blob,iVar11,iVar20,(this->super_Convolution).num_output / (int)local_e0,
              (ulong)local_e0 * (uVar18 / local_90),local_e0,opt->blob_allocator);
  iVar12 = local_7c;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0018b1fd;
  if (((opt->use_packing_layout == false) &&
      ((((((this->super_Convolution).kernel_w == (this->super_Convolution).kernel_h &&
          (iVar3 = (this->super_Convolution).dilation_w, iVar3 != 1)) &&
         (iVar14 = (this->super_Convolution).dilation_h, iVar14 == iVar3)) &&
        (((this->super_Convolution).stride_w == 1 && ((this->super_Convolution).stride_h == 1)))) &&
       (iVar3 <= iVar11)))) && (iVar14 <= iVar20)) {
    iVar14 = forwardDilation_x86(this,&local_128,top_blob,opt);
    goto LAB_0018b1fd;
  }
  iVar11 = local_dc * (int)uVar8;
  bVar2 = opt->use_winograd23_convolution;
  if (((bVar2 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar21 = false;
  }
  else {
    bVar21 = true;
    if (iVar11 < 9) {
      bVar21 = 8 < (this->super_Convolution).num_output;
    }
  }
  auVar1._0_4_ = (this->super_Convolution).kernel_w;
  auVar1._4_4_ = (this->super_Convolution).kernel_h;
  auVar1._8_4_ = (this->super_Convolution).dilation_w;
  auVar1._12_4_ = (this->super_Convolution).dilation_h;
  if ((((auVar1 == _DAT_005f2380) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar21)))) {
    iVar20 = (this->super_Convolution).num_output;
    iVar3 = (int)local_88;
    bVar9 = test_prefer_winograd63(iVar11,iVar20,(int)local_88,local_7c);
    bVar10 = test_prefer_winograd23(iVar11,iVar20,iVar3,iVar12);
    bVar21 = !bVar9 && !bVar10;
    if ((bVar10) &&
       (((bVar2 == false || ((this->weight_winograd23_data).data == (void *)0x0)) ||
        (bVar10 = true,
        (long)(this->weight_winograd23_data).c * (this->weight_winograd23_data).cstep == 0)))) {
      bVar21 = true;
      bVar10 = false;
    }
    if ((bVar9) &&
       (((opt->use_winograd63_convolution != true ||
         ((this->weight_winograd63_data).data == (void *)0x0)) ||
        (bVar9 = true,
        (long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep == 0)))) {
      bVar21 = true;
      bVar9 = false;
    }
    if ((bVar21) &&
       (((opt->use_winograd43_convolution != true ||
         ((this->weight_winograd43_data).data == (void *)0x0)) ||
        ((long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep == 0)))) {
      if (((opt->use_winograd63_convolution == true) &&
          ((this->weight_winograd63_data).data != (void *)0x0)) &&
         ((long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep != 0)) {
        bVar9 = true;
      }
      else {
        bVar10 = true;
      }
      bVar21 = false;
    }
    iVar11 = this->nT;
    iVar20 = iVar11;
    if (iVar11 == 0) {
      iVar20 = opt->num_threads;
    }
    if (opt->num_threads != iVar11 && iVar11 != 0) {
      forward();
    }
    if (bVar10 == false) {
      if (bVar21) {
        iVar14 = conv3x3s1_winograd43
                           (&local_128,top_blob_00,&this->weight_winograd43_data,
                            &(this->super_Convolution).bias_data,iVar20,opt);
      }
      else {
        iVar14 = 0;
        if (bVar9 != false) {
          iVar14 = conv3x3s1_winograd63
                             (&local_128,top_blob_00,&this->weight_winograd63_data,
                              &(this->super_Convolution).bias_data,iVar20,opt);
        }
      }
    }
    else {
      iVar14 = conv3x3s1_winograd23
                         (&local_128,top_blob_00,&this->weight_winograd23_data,
                          &(this->super_Convolution).bias_data,iVar20,opt);
    }
    if (iVar14 == 0) {
      pLVar6 = this->activation;
      iVar14 = 0;
      if (pLVar6 != (Layer *)0x0) {
        (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob_00,opt);
      }
    }
    goto LAB_0018b1fd;
  }
  iVar12 = get_cpu_level2_cache_size();
  iVar20 = (this->super_Convolution).num_output;
  uVar4 = (this->super_Convolution).kernel_w;
  opt_00 = (Option *)(ulong)uVar4;
  kernel_h = (this->super_Convolution).kernel_h;
  dilation_w = (this->super_Convolution).dilation_w;
  uVar18 = (ulong)dilation_w;
  dilation_h = (this->super_Convolution).dilation_h;
  stride_w = (this->super_Convolution).stride_w;
  stride_h = (this->super_Convolution).stride_h;
  if (((opt->use_sgemm_convolution == true) &&
      (iVar12 < (int)(stride_w * stride_h *
                      kernel_h * dilation_w * dilation_h * iVar20 * uVar4 * iVar11 * 8) ||
       (0x10 < iVar11 || 0x10 < iVar20))) || (kernel_h == 1 && uVar4 == 1)) {
    iVar11 = this->nT;
    iVar20 = iVar11;
    if (iVar11 == 0) {
      iVar20 = opt->num_threads;
    }
    if (opt->num_threads != iVar11 && iVar11 != 0) {
      forward();
    }
    iVar14 = convolution_im2col_gemm
                       (&local_128,top_blob_00,&this->weight_sgemm_data,
                        &(this->super_Convolution).bias_data,(this->super_Convolution).kernel_w,
                        (this->super_Convolution).kernel_h,(this->super_Convolution).dilation_w,
                        (this->super_Convolution).dilation_h,(this->super_Convolution).stride_w,
                        (this->super_Convolution).stride_h,iVar20,opt);
    if (iVar14 == 0) {
      pLVar6 = this->activation;
      iVar14 = 0;
      if (pLVar6 != (Layer *)0x0) {
        (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob_00,opt);
      }
    }
    goto LAB_0018b1fd;
  }
  iVar11 = (int)local_90;
  uVar15 = uVar4 ^ 3;
  uVar13 = kernel_h ^ 3;
  uVar16 = dilation_w ^ 1;
  local_dc = dilation_h ^ 1;
  uVar19 = stride_w ^ 1;
  uVar17 = stride_h ^ 1;
  local_88 = uVar18;
  if ((((iVar11 == 0x10 && (local_e0 ^ 1) == 0) && (uVar13 == 0 && uVar15 == 0)) &&
      ((uVar16 == 0 && local_dc == 0) && uVar19 == 0)) && uVar17 == 0) {
    conv3x3s1_pack16to1_avx512
              (&local_128,top_blob_00,&this->weight_data_tm,&(this->super_Convolution).bias_data,
               opt_00);
LAB_0018b10c:
    pLVar6 = this->activation;
    if (pLVar6 != (Layer *)0x0) {
      (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob_00,opt);
    }
  }
  else {
    if ((iVar11 == 8) && (local_e0 == 8)) {
      if ((((uVar13 == 0 && uVar15 == 0) && (uVar16 == 0 && local_dc == 0)) && uVar19 == 0) &&
          uVar17 == 0) {
        conv3x3s1_pack8_avx(&local_128,top_blob_00,&this->weight_data_tm,
                            &(this->super_Convolution).bias_data,opt_00);
      }
      else {
        if ((((kernel_h != 2 || uVar4 != 2) || (uVar16 != 0 || local_dc != 0)) || uVar19 != 0) ||
            uVar17 != 0) goto LAB_0018b551;
        conv2x2s1_pack8_avx(&local_128,top_blob_00,&this->weight_data_tm,
                            &(this->super_Convolution).bias_data,opt_00);
      }
      goto LAB_0018b10c;
    }
LAB_0018b551:
    if ((iVar11 == 1) && (local_e0 == 8)) {
      bVar2 = uVar13 != 0 || uVar15 != 0;
      if ((stride_w != 1 || stride_h != 1) || ((bVar2 || uVar16 != 0) || local_dc != 0)) {
        if (((bVar2 || uVar16 != 0) || local_dc != 0) || (stride_h != 2 || stride_w != 2))
        goto LAB_0018b5f3;
        conv3x3s2_pack1to8_avx
                  (&local_128,top_blob_00,&this->weight_data_tm,&(this->super_Convolution).bias_data
                   ,opt_00);
      }
      else {
        conv3x3s1_pack1to8_avx
                  (&local_128,top_blob_00,&this->weight_data_tm,&(this->super_Convolution).bias_data
                   ,opt_00);
      }
      goto LAB_0018b10c;
    }
LAB_0018b5f3:
    if ((((iVar11 == 8 && (local_e0 ^ 1) == 0) && (uVar13 == 0 && uVar15 == 0)) &&
        ((uVar16 == 0 && local_dc == 0) && uVar19 == 0)) && uVar17 == 0) {
      conv3x3s1_pack8to1_avx
                (&local_128,top_blob_00,&this->weight_data_tm,&(this->super_Convolution).bias_data,
                 opt_00);
      goto LAB_0018b10c;
    }
    if ((iVar11 == 1) && (local_e0 == 4)) {
      bVar2 = uVar13 != 0 || uVar15 != 0;
      if ((stride_w != 1 || stride_h != 1) || ((bVar2 || uVar16 != 0) || local_dc != 0)) {
        if (((bVar2 || uVar16 != 0) || local_dc != 0) || (stride_h != 2 || stride_w != 2))
        goto LAB_0018b6c4;
        conv3x3s2_pack1to4_sse
                  (&local_128,top_blob_00,&this->weight_data_tm,&(this->super_Convolution).bias_data
                   ,opt_00);
      }
      else {
        conv3x3s1_pack1to4_sse
                  (&local_128,top_blob_00,&this->weight_data_tm,&(this->super_Convolution).bias_data
                   ,opt_00);
      }
      goto LAB_0018b10c;
    }
LAB_0018b6c4:
    convolution_packed(&local_128,top_blob_00,&this->weight_data_tm,
                       &(this->super_Convolution).bias_data,uVar4,kernel_h,dilation_w,dilation_h,
                       stride_w,stride_h,(this->super_Convolution).activation_type,
                       &(this->super_Convolution).activation_params,(Option *)top_blob_00);
  }
  iVar14 = 0;
LAB_0018b1fd:
  piVar5 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar5 == (int *)0x0) {
    return iVar14;
  }
  LOCK();
  *piVar5 = *piVar5 + -1;
  UNLOCK();
  if (*piVar5 != 0) {
    return iVar14;
  }
  if (local_128.allocator != (Allocator *)0x0) {
    (*(local_128.allocator)->_vptr_Allocator[3])();
    return iVar14;
  }
  if (local_128.data == (void *)0x0) {
    return iVar14;
  }
  free(local_128.data);
  return iVar14;
}

Assistant:

int Convolution_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}